

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

void __thiscall cppnet::BufferQueue::Reset(BufferQueue *this)

{
  List<cppnet::BufferBlock>::Clear(&this->_buffer_list);
  std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_buffer_write).
              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void BufferQueue::Reset() {
    _buffer_list.Clear();
    _buffer_write.reset();
}